

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void store_coding_context(MACROBLOCK *x,PICK_MODE_CONTEXT *ctx,int skippable)

{
  uint8_t ref_frame_type;
  undefined4 in_EDX;
  void *in_RSI;
  long in_RDI;
  MACROBLOCKD *xd;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffc8;
  
  *(undefined1 *)((long)in_RSI + 0x1c8) = *(undefined1 *)(in_RDI + 0x24e08);
  *(undefined4 *)((long)in_RSI + 0x1a4) = in_EDX;
  memcpy(in_RSI,(void *)**(undefined8 **)(in_RDI + 0x2058),0xb0);
  ref_frame_type = av1_ref_frame_type(in_stack_ffffffffffffffc8);
  av1_copy_mbmi_ext_to_mbmi_ext_frame
            ((MB_MODE_INFO_EXT_FRAME *)((long)in_RSI + 0xb0),(MB_MODE_INFO_EXT *)(in_RDI + 0x3c70),
             ref_frame_type);
  return;
}

Assistant:

static inline void store_coding_context(
#if CONFIG_INTERNAL_STATS
    MACROBLOCK *x, PICK_MODE_CONTEXT *ctx, int mode_index,
#else
    MACROBLOCK *x, PICK_MODE_CONTEXT *ctx,
#endif  // CONFIG_INTERNAL_STATS
    int skippable) {
  MACROBLOCKD *const xd = &x->e_mbd;

  // Take a snapshot of the coding context so it can be
  // restored if we decide to encode this way
  ctx->rd_stats.skip_txfm = x->txfm_search_info.skip_txfm;
  ctx->skippable = skippable;
#if CONFIG_INTERNAL_STATS
  ctx->best_mode_index = mode_index;
#endif  // CONFIG_INTERNAL_STATS
  ctx->mic = *xd->mi[0];
  av1_copy_mbmi_ext_to_mbmi_ext_frame(&ctx->mbmi_ext_best, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
}